

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O3

int CVodeRootInit(void *cvode_mem,int nrtfn,CVRootFn g)

{
  uint uVar1;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  void *pvVar2;
  long lVar3;
  int error_code;
  char *msgfmt;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar13 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar8 = 0x336;
  }
  else {
    uVar4 = 0;
    if (0 < nrtfn) {
      uVar4 = nrtfn;
    }
    uVar1 = *(uint *)((long)cvode_mem + 0x568);
    if (0 < (int)uVar1 && uVar4 != uVar1) {
      free(*(void **)((long)cvode_mem + 0x598));
      *(undefined8 *)((long)cvode_mem + 0x598) = 0;
      free(*(void **)((long)cvode_mem + 0x5a0));
      *(undefined8 *)((long)cvode_mem + 0x5a0) = 0;
      free(*(void **)((long)cvode_mem + 0x5a8));
      *(undefined8 *)((long)cvode_mem + 0x5a8) = 0;
      free(*(void **)((long)cvode_mem + 0x570));
      *(undefined8 *)((long)cvode_mem + 0x570) = 0;
      free(*(void **)((long)cvode_mem + 0x578));
      *(undefined8 *)((long)cvode_mem + 0x578) = 0;
      free(*(void **)((long)cvode_mem + 0x5d0));
      *(undefined8 *)((long)cvode_mem + 0x5d0) = 0;
      uVar1 = *(uint *)((long)cvode_mem + 0x568);
      lVar3 = (long)(int)uVar1 * 3;
      auVar9._8_4_ = (int)lVar3;
      auVar9._0_8_ = lVar3;
      auVar9._12_4_ = (int)((ulong)lVar3 >> 0x20);
      *(long *)((long)cvode_mem + 0x3c0) =
           *(long *)((long)cvode_mem + 0x3c0) + (long)(int)uVar1 * -3;
      *(long *)((long)cvode_mem + 0x3c8) = *(long *)((long)cvode_mem + 0x3c8) - auVar9._8_8_;
    }
    if (nrtfn < 1) {
      *(undefined4 *)((long)cvode_mem + 0x568) = 0;
      *(undefined8 *)((long)cvode_mem + 0x560) = 0;
      return 0;
    }
    if (uVar4 == uVar1) {
      if (*(CVRootFn *)((long)cvode_mem + 0x560) == g) {
        return 0;
      }
      if (g != (CVRootFn)0x0) {
        *(CVRootFn *)((long)cvode_mem + 0x560) = g;
        return 0;
      }
      free(*(void **)((long)cvode_mem + 0x598));
      *(undefined8 *)((long)cvode_mem + 0x598) = 0;
      free(*(void **)((long)cvode_mem + 0x5a0));
      *(undefined8 *)((long)cvode_mem + 0x5a0) = 0;
      free(*(void **)((long)cvode_mem + 0x5a8));
      *(undefined8 *)((long)cvode_mem + 0x5a8) = 0;
      free(*(void **)((long)cvode_mem + 0x570));
      *(undefined8 *)((long)cvode_mem + 0x570) = 0;
      free(*(void **)((long)cvode_mem + 0x578));
      *(undefined8 *)((long)cvode_mem + 0x578) = 0;
      free(*(void **)((long)cvode_mem + 0x5d0));
      *(undefined8 *)((long)cvode_mem + 0x5d0) = 0;
      *(ulong *)((long)cvode_mem + 0x3c0) = *(long *)((long)cvode_mem + 0x3c0) - (ulong)(uVar4 * 3);
      *(ulong *)((long)cvode_mem + 0x3c8) = *(long *)((long)cvode_mem + 0x3c8) - (ulong)(uVar4 * 3);
      msgfmt = "g = NULL illegal.";
      iVar13 = -0x16;
      error_code = -0x16;
      iVar8 = 0x377;
    }
    else {
      *(uint *)((long)cvode_mem + 0x568) = uVar4;
      if (g == (CVRootFn)0x0) {
        msgfmt = "g = NULL illegal.";
        iVar13 = -0x16;
        error_code = -0x16;
        iVar8 = 0x388;
      }
      else {
        *(CVRootFn *)((long)cvode_mem + 0x560) = g;
        sVar6 = (ulong)uVar4 * 8;
        __ptr = malloc(sVar6);
        *(void **)((long)cvode_mem + 0x598) = __ptr;
        if (__ptr == (void *)0x0) {
          msgfmt = "A memory request failed.";
          iVar13 = -0x14;
          error_code = -0x14;
          iVar8 = 0x393;
        }
        else {
          __ptr_00 = malloc(sVar6);
          *(void **)((long)cvode_mem + 0x5a0) = __ptr_00;
          if (__ptr_00 == (void *)0x0) {
            free(__ptr);
            *(undefined8 *)((long)cvode_mem + 0x598) = 0;
            msgfmt = "A memory request failed.";
            iVar13 = -0x14;
            error_code = -0x14;
            iVar8 = 0x39e;
          }
          else {
            __ptr_01 = malloc(sVar6);
            *(void **)((long)cvode_mem + 0x5a8) = __ptr_01;
            if (__ptr_01 == (void *)0x0) {
              free(__ptr);
              *(undefined8 *)((long)cvode_mem + 0x598) = 0;
              free(__ptr_00);
              *(undefined8 *)((long)cvode_mem + 0x5a0) = 0;
              msgfmt = "A memory request failed.";
              iVar13 = -0x14;
              error_code = -0x14;
              iVar8 = 0x3ab;
            }
            else {
              sVar6 = (ulong)uVar4 << 2;
              __ptr_02 = malloc(sVar6);
              *(void **)((long)cvode_mem + 0x570) = __ptr_02;
              if (__ptr_02 == (void *)0x0) {
                free(__ptr);
                *(undefined8 *)((long)cvode_mem + 0x598) = 0;
                free(__ptr_00);
                *(undefined8 *)((long)cvode_mem + 0x5a0) = 0;
                free(__ptr_01);
                *(undefined8 *)((long)cvode_mem + 0x5a8) = 0;
                msgfmt = "A memory request failed.";
                iVar13 = -0x14;
                error_code = -0x14;
                iVar8 = 0x3ba;
              }
              else {
                __ptr_03 = malloc(sVar6);
                *(void **)((long)cvode_mem + 0x578) = __ptr_03;
                if (__ptr_03 == (void *)0x0) {
                  free(__ptr);
                  *(undefined8 *)((long)cvode_mem + 0x598) = 0;
                  free(__ptr_00);
                  *(undefined8 *)((long)cvode_mem + 0x5a0) = 0;
                  free(__ptr_01);
                  *(undefined8 *)((long)cvode_mem + 0x5a8) = 0;
                  free(__ptr_02);
                  *(undefined8 *)((long)cvode_mem + 0x570) = 0;
                  msgfmt = "A memory request failed.";
                  iVar13 = -0x14;
                  error_code = -0x14;
                  iVar8 = 0x3cb;
                }
                else {
                  pvVar2 = malloc(sVar6);
                  *(void **)((long)cvode_mem + 0x5d0) = pvVar2;
                  if (pvVar2 != (void *)0x0) {
                    lVar5 = 0;
                    memset(__ptr_03,0,(ulong)(uint)nrtfn * 4);
                    auVar9 = _DAT_00122060;
                    lVar3 = (ulong)(uint)nrtfn - 1;
                    auVar7._8_4_ = (int)lVar3;
                    auVar7._0_8_ = lVar3;
                    auVar7._12_4_ = (int)((ulong)lVar3 >> 0x20);
                    auVar7 = auVar7 ^ _DAT_00122060;
                    auVar10 = _DAT_00122040;
                    auVar11 = _DAT_00122050;
                    do {
                      auVar12 = auVar11 ^ auVar9;
                      iVar8 = auVar7._4_4_;
                      if ((bool)(~(auVar12._4_4_ == iVar8 && auVar7._0_4_ < auVar12._0_4_ ||
                                  iVar8 < auVar12._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar2 + lVar5) = 1;
                      }
                      if ((auVar12._12_4_ != auVar7._12_4_ || auVar12._8_4_ <= auVar7._8_4_) &&
                          auVar12._12_4_ <= auVar7._12_4_) {
                        *(undefined4 *)((long)pvVar2 + lVar5 + 4) = 1;
                      }
                      auVar12 = auVar10 ^ auVar9;
                      iVar13 = auVar12._4_4_;
                      if (iVar13 <= iVar8 && (iVar13 != iVar8 || auVar12._0_4_ <= auVar7._0_4_)) {
                        *(undefined4 *)((long)pvVar2 + lVar5 + 8) = 1;
                        *(undefined4 *)((long)pvVar2 + lVar5 + 0xc) = 1;
                      }
                      lVar3 = auVar11._8_8_;
                      auVar11._0_8_ = auVar11._0_8_ + 4;
                      auVar11._8_8_ = lVar3 + 4;
                      lVar3 = auVar10._8_8_;
                      auVar10._0_8_ = auVar10._0_8_ + 4;
                      auVar10._8_8_ = lVar3 + 4;
                      lVar5 = lVar5 + 0x10;
                    } while ((ulong)(nrtfn + 3U >> 2) << 4 != lVar5);
                    *(ulong *)((long)cvode_mem + 0x3c0) =
                         (ulong)(uVar4 * 3) + *(long *)((long)cvode_mem + 0x3c0);
                    *(ulong *)((long)cvode_mem + 0x3c8) =
                         (ulong)(uVar4 * 3) + *(long *)((long)cvode_mem + 0x3c8);
                    return 0;
                  }
                  free(__ptr);
                  *(undefined8 *)((long)cvode_mem + 0x598) = 0;
                  free(__ptr_00);
                  *(undefined8 *)((long)cvode_mem + 0x5a0) = 0;
                  free(__ptr_01);
                  *(undefined8 *)((long)cvode_mem + 0x5a8) = 0;
                  free(__ptr_02);
                  *(undefined8 *)((long)cvode_mem + 0x570) = 0;
                  free(__ptr_03);
                  *(undefined8 *)((long)cvode_mem + 0x578) = 0;
                  msgfmt = "A memory request failed.";
                  iVar13 = -0x14;
                  error_code = -0x14;
                  iVar8 = 0x3de;
                }
              }
            }
          }
        }
      }
    }
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar8,"CVodeRootInit",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                 ,msgfmt);
  return iVar13;
}

Assistant:

int CVodeRootInit(void* cvode_mem, int nrtfn, CVRootFn g)
{
  CVodeMem cv_mem;
  int i, nrt;

  /* Check cvode_mem pointer */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  nrt = (nrtfn < 0) ? 0 : nrtfn;

  /* If rerunning CVodeRootInit() with a different number of root
     functions (changing number of gfun components), then free
     currently held memory resources */
  if ((nrt != cv_mem->cv_nrtfn) && (cv_mem->cv_nrtfn > 0))
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    free(cv_mem->cv_iroots);
    cv_mem->cv_iroots = NULL;
    free(cv_mem->cv_rootdir);
    cv_mem->cv_rootdir = NULL;
    free(cv_mem->cv_gactive);
    cv_mem->cv_gactive = NULL;

    cv_mem->cv_lrw -= 3 * (cv_mem->cv_nrtfn);
    cv_mem->cv_liw -= 3 * (cv_mem->cv_nrtfn);
  }

  /* If CVodeRootInit() was called with nrtfn == 0, then set cv_nrtfn to
     zero and cv_gfun to NULL before returning */
  if (nrt == 0)
  {
    cv_mem->cv_nrtfn = nrt;
    cv_mem->cv_gfun  = NULL;
    return (CV_SUCCESS);
  }

  /* If rerunning CVodeRootInit() with the same number of root functions
     (not changing number of gfun components), then check if the root
     function argument has changed */
  /* If g != NULL then return as currently reserved memory resources
     will suffice */
  if (nrt == cv_mem->cv_nrtfn)
  {
    if (g != cv_mem->cv_gfun)
    {
      if (g == NULL)
      {
        free(cv_mem->cv_glo);
        cv_mem->cv_glo = NULL;
        free(cv_mem->cv_ghi);
        cv_mem->cv_ghi = NULL;
        free(cv_mem->cv_grout);
        cv_mem->cv_grout = NULL;
        free(cv_mem->cv_iroots);
        cv_mem->cv_iroots = NULL;
        free(cv_mem->cv_rootdir);
        cv_mem->cv_rootdir = NULL;
        free(cv_mem->cv_gactive);
        cv_mem->cv_gactive = NULL;

        cv_mem->cv_lrw -= 3 * nrt;
        cv_mem->cv_liw -= 3 * nrt;

        cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                       MSGCV_NULL_G);
        return (CV_ILL_INPUT);
      }
      else
      {
        cv_mem->cv_gfun = g;
        return (CV_SUCCESS);
      }
    }
    else { return (CV_SUCCESS); }
  }

  /* Set variable values in CVode memory block */
  cv_mem->cv_nrtfn = nrt;
  if (g == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_G);
    return (CV_ILL_INPUT);
  }
  else { cv_mem->cv_gfun = g; }

  /* Allocate necessary memory and return */
  cv_mem->cv_glo = NULL;
  cv_mem->cv_glo = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (cv_mem->cv_glo == NULL)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_ghi = NULL;
  cv_mem->cv_ghi = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (cv_mem->cv_ghi == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_grout = NULL;
  cv_mem->cv_grout = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (cv_mem->cv_grout == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_iroots = NULL;
  cv_mem->cv_iroots = (int*)malloc(nrt * sizeof(int));
  if (cv_mem->cv_iroots == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_rootdir = NULL;
  cv_mem->cv_rootdir = (int*)malloc(nrt * sizeof(int));
  if (cv_mem->cv_rootdir == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    free(cv_mem->cv_iroots);
    cv_mem->cv_iroots = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_gactive = NULL;
  cv_mem->cv_gactive = (sunbooleantype*)malloc(nrt * sizeof(sunbooleantype));
  if (cv_mem->cv_gactive == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    free(cv_mem->cv_iroots);
    cv_mem->cv_iroots = NULL;
    free(cv_mem->cv_rootdir);
    cv_mem->cv_rootdir = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  /* Set default values for rootdir (both directions) */
  for (i = 0; i < nrt; i++) { cv_mem->cv_rootdir[i] = 0; }

  /* Set default values for gactive (all active) */
  for (i = 0; i < nrt; i++) { cv_mem->cv_gactive[i] = SUNTRUE; }

  cv_mem->cv_lrw += 3 * nrt;
  cv_mem->cv_liw += 3 * nrt;

  return (CV_SUCCESS);
}